

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addTargets.hpp
# Opt level: O2

void helics::
     addTargetVariations<toml::basic_value<toml::type_config>,helics::ValueFederate::registerValueInterfacesToml(std::__cxx11::string_const&)::__2>
               (basic_value<toml::type_config> *section,string *name1,string *name2,
               anon_class_8_1_ba1d534b callback)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+(&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name1,"_");
  std::operator+(&local_b0,&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name2);
  bVar2 = addTargets<helics::ValueFederate::registerValueInterfacesToml(std::__cxx11::string_const&)::__2>
                    (section,(string *)&local_b0,callback);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar2) {
    std::operator+(&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name2);
    bVar2 = addTargets<helics::ValueFederate::registerValueInterfacesToml(std::__cxx11::string_const&)::__2>
                      (section,(string *)&local_70,callback);
    std::__cxx11::string::~string((string *)&local_70);
    if (!bVar2) {
      pcVar1 = (name2->_M_dataplus)._M_p;
      iVar3 = toupper((int)*pcVar1);
      *pcVar1 = (char)iVar3;
      std::operator+(&local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name2);
      addTargets<helics::ValueFederate::registerValueInterfacesToml(std::__cxx11::string_const&)::__2>
                (section,(string *)&local_90,callback);
      std::__cxx11::string::~string((string *)&local_90);
    }
  }
  return;
}

Assistant:

void addTargetVariations(const Block& section,
                         const std::string& name1,
                         std::string name2,
                         Callable callback)
{
    bool found = addTargets(section, name1 + "_" + name2, callback);
    if (!found) {
        found = addTargets(section, name1 + name2, callback);
    }
    if (!found) {
        name2.front() = std::toupper(name2.front());
        addTargets(section, name1 + name2, callback);
    }
}